

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::FastPath(double significand,int exp)

{
  double dVar1;
  int exp_local;
  double significand_local;
  
  if (exp < -0x134) {
    significand_local = 0.0;
  }
  else if (exp < 0) {
    dVar1 = Pow10(-exp);
    significand_local = significand / dVar1;
  }
  else {
    dVar1 = Pow10(exp);
    significand_local = significand * dVar1;
  }
  return significand_local;
}

Assistant:

inline double FastPath(double significand, int exp) {
    if (exp < -308)
        return 0.0;
    else if (exp >= 0)
        return significand * internal::Pow10(exp);
    else
        return significand / internal::Pow10(-exp);
}